

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::Extension::SerializeFieldWithCachedSizes
          (Extension *this,int number,CodedOutputStream *output)

{
  int iVar1;
  FieldType FVar2;
  int iVar3;
  uint *puVar4;
  int *piVar5;
  long *plVar6;
  unsigned_long *puVar7;
  float *pfVar8;
  double *pdVar9;
  bool *pbVar10;
  LogMessage *other;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  MessageLite *pMVar12;
  int local_e8;
  int local_e4;
  int i_31;
  int i_30;
  int i_29;
  int i_28;
  int i_27;
  int i_26;
  int i_25;
  int i_24;
  int i_23;
  int i_22;
  int i_21;
  int i_20;
  int i_19;
  int i_18;
  int i_17;
  int i_16;
  int i_15;
  int i_14;
  LogMessage local_90;
  int local_58;
  int local_54;
  int i_13;
  int i_12;
  int i_11;
  int i_10;
  int i_9;
  int i_8;
  int i_7;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  CodedOutputStream *output_local;
  Extension *pEStack_10;
  int number_local;
  Extension *this_local;
  
  _i_1 = output;
  output_local._4_4_ = number;
  pEStack_10 = this;
  if ((this->is_repeated & 1U) == 0) {
    if ((this->field_0xa & 1) == 0) {
      FVar2 = anon_unknown_29::real_type(this->type);
      switch(FVar2) {
      case TYPE_DOUBLE:
        WireFormatLite::WriteDouble(output_local._4_4_,(this->field_0).double_value,_i_1);
        break;
      case TYPE_FLOAT:
        WireFormatLite::WriteFloat(output_local._4_4_,(this->field_0).float_value,_i_1);
        break;
      case TYPE_INT64:
        WireFormatLite::WriteInt64(output_local._4_4_,(this->field_0).int64_value,_i_1);
        break;
      case TYPE_UINT64:
        WireFormatLite::WriteUInt64(output_local._4_4_,(this->field_0).uint64_value,_i_1);
        break;
      case TYPE_INT32:
        WireFormatLite::WriteInt32(output_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case TYPE_FIXED64:
        WireFormatLite::WriteFixed64(output_local._4_4_,(this->field_0).uint64_value,_i_1);
        break;
      case TYPE_FIXED32:
        WireFormatLite::WriteFixed32(output_local._4_4_,(this->field_0).uint32_value,_i_1);
        break;
      case TYPE_BOOL:
        WireFormatLite::WriteBool(output_local._4_4_,(bool)((this->field_0).bool_value & 1),_i_1);
        break;
      case TYPE_STRING:
        WireFormatLite::WriteString(output_local._4_4_,(this->field_0).string_value,_i_1);
        break;
      case TYPE_GROUP:
        WireFormatLite::WriteGroup(output_local._4_4_,(this->field_0).message_value,_i_1);
        break;
      case TYPE_MESSAGE:
        if (((byte)this->field_0xa >> 4 & 1) == 0) {
          WireFormatLite::WriteMessage(output_local._4_4_,(this->field_0).message_value,_i_1);
        }
        else {
          (**(code **)((((this->field_0).repeated_string_value)->super_RepeatedPtrFieldBase).arena_
                      + 0x78))((this->field_0).repeated_string_value,output_local._4_4_,_i_1);
        }
        break;
      case TYPE_BYTES:
        WireFormatLite::WriteBytes(output_local._4_4_,(this->field_0).string_value,_i_1);
        break;
      case TYPE_UINT32:
        WireFormatLite::WriteUInt32(output_local._4_4_,(this->field_0).uint32_value,_i_1);
        break;
      case TYPE_ENUM:
        WireFormatLite::WriteEnum(output_local._4_4_,(this->field_0).enum_value,_i_1);
        break;
      case TYPE_SFIXED32:
        WireFormatLite::WriteSFixed32(output_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case TYPE_SFIXED64:
        WireFormatLite::WriteSFixed64(output_local._4_4_,(this->field_0).int64_value,_i_1);
        break;
      case TYPE_SINT32:
        WireFormatLite::WriteSInt32(output_local._4_4_,(this->field_0).int32_value,_i_1);
        break;
      case MAX_FIELD_TYPE:
        WireFormatLite::WriteSInt64(output_local._4_4_,(this->field_0).int64_value,_i_1);
      }
    }
  }
  else if ((this->is_packed & 1U) == 0) {
    FVar2 = anon_unknown_29::real_type(this->type);
    switch(FVar2) {
    case TYPE_DOUBLE:
      for (i_27 = 0; iVar3 = RepeatedField<double>::size((this->field_0).repeated_double_value),
          iVar1 = output_local._4_4_, i_27 < iVar3; i_27 = i_27 + 1) {
        pdVar9 = RepeatedField<double>::Get((this->field_0).repeated_double_value,i_27);
        WireFormatLite::WriteDouble(iVar1,*pdVar9,_i_1);
      }
      break;
    case TYPE_FLOAT:
      for (i_26 = 0; iVar3 = RepeatedField<float>::size((this->field_0).repeated_float_value),
          iVar1 = output_local._4_4_, i_26 < iVar3; i_26 = i_26 + 1) {
        pfVar8 = RepeatedField<float>::Get((this->field_0).repeated_float_value,i_26);
        WireFormatLite::WriteFloat(iVar1,*pfVar8,_i_1);
      }
      break;
    case TYPE_INT64:
      for (i_17 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = output_local._4_4_, i_17 < iVar3; i_17 = i_17 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_17);
        WireFormatLite::WriteInt64(iVar1,*plVar6,_i_1);
      }
      break;
    case TYPE_UINT64:
      for (i_19 = 0;
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 = output_local._4_4_, i_19 < iVar3; i_19 = i_19 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_19);
        WireFormatLite::WriteUInt64(iVar1,*puVar7,_i_1);
      }
      break;
    case TYPE_INT32:
      for (i_16 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_16 < iVar3; i_16 = i_16 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_16);
        WireFormatLite::WriteInt32(iVar1,*piVar5,_i_1);
      }
      break;
    case TYPE_FIXED64:
      for (i_23 = 0;
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 = output_local._4_4_, i_23 < iVar3; i_23 = i_23 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_23);
        WireFormatLite::WriteFixed64(iVar1,*puVar7,_i_1);
      }
      break;
    case TYPE_FIXED32:
      for (i_22 = 0;
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 = output_local._4_4_, i_22 < iVar3; i_22 = i_22 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_22);
        WireFormatLite::WriteFixed32(iVar1,*puVar4,_i_1);
      }
      break;
    case TYPE_BOOL:
      for (i_28 = 0; iVar3 = RepeatedField<bool>::size((this->field_0).repeated_bool_value),
          iVar1 = output_local._4_4_, i_28 < iVar3; i_28 = i_28 + 1) {
        pbVar10 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,i_28);
        WireFormatLite::WriteBool(iVar1,(bool)(*pbVar10 & 1),_i_1);
      }
      break;
    case TYPE_STRING:
      for (i_29 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), iVar1 = output_local._4_4_,
          i_29 < iVar3; i_29 = i_29 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_29);
        WireFormatLite::WriteString(iVar1,pbVar11,_i_1);
      }
      break;
    case TYPE_GROUP:
      for (local_e4 = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), iVar1 = output_local._4_4_,
          local_e4 < iVar3; local_e4 = local_e4 + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_e4);
        WireFormatLite::WriteGroup(iVar1,pMVar12,_i_1);
      }
      break;
    case TYPE_MESSAGE:
      for (local_e8 = 0;
          iVar3 = RepeatedPtrField<google::protobuf::MessageLite>::size
                            ((this->field_0).repeated_message_value), iVar1 = output_local._4_4_,
          local_e8 < iVar3; local_e8 = local_e8 + 1) {
        pMVar12 = RepeatedPtrField<google::protobuf::MessageLite>::Get
                            ((this->field_0).repeated_message_value,local_e8);
        WireFormatLite::WriteMessage(iVar1,pMVar12,_i_1);
      }
      break;
    case TYPE_BYTES:
      for (i_30 = 0;
          iVar3 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::size((this->field_0).repeated_string_value), iVar1 = output_local._4_4_,
          i_30 < iVar3; i_30 = i_30 + 1) {
        pbVar11 = RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::Get((this->field_0).repeated_string_value,i_30);
        WireFormatLite::WriteBytes(iVar1,pbVar11,_i_1);
      }
      break;
    case TYPE_UINT32:
      for (i_18 = 0;
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 = output_local._4_4_, i_18 < iVar3; i_18 = i_18 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_18);
        WireFormatLite::WriteUInt32(iVar1,*puVar4,_i_1);
      }
      break;
    case TYPE_ENUM:
      for (i_31 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_31 < iVar3; i_31 = i_31 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_31);
        WireFormatLite::WriteEnum(iVar1,*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED32:
      for (i_24 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_24 < iVar3; i_24 = i_24 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_24);
        WireFormatLite::WriteSFixed32(iVar1,*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED64:
      for (i_25 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = output_local._4_4_, i_25 < iVar3; i_25 = i_25 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_25);
        WireFormatLite::WriteSFixed64(iVar1,*plVar6,_i_1);
      }
      break;
    case TYPE_SINT32:
      for (i_20 = 0; iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value),
          iVar1 = output_local._4_4_, i_20 < iVar3; i_20 = i_20 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_20);
        WireFormatLite::WriteSInt32(iVar1,*piVar5,_i_1);
      }
      break;
    case MAX_FIELD_TYPE:
      for (i_21 = 0; iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value),
          iVar1 = output_local._4_4_, i_21 < iVar3; i_21 = i_21 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_21);
        WireFormatLite::WriteSInt64(iVar1,*plVar6,_i_1);
      }
    }
  }
  else if (this->cached_size != 0) {
    WireFormatLite::WriteTag(number,WIRETYPE_LENGTH_DELIMITED,output);
    io::CodedOutputStream::WriteVarint32(_i_1,this->cached_size);
    FVar2 = anon_unknown_29::real_type(this->type);
    switch(FVar2) {
    case TYPE_DOUBLE:
      for (i_13 = 0; iVar1 = i_13,
          iVar3 = RepeatedField<double>::size((this->field_0).repeated_double_value), iVar1 < iVar3;
          i_13 = i_13 + 1) {
        pdVar9 = RepeatedField<double>::Get((this->field_0).repeated_double_value,i_13);
        WireFormatLite::WriteDoubleNoTag(*pdVar9,_i_1);
      }
      break;
    case TYPE_FLOAT:
      for (i_12 = 0; iVar1 = i_12,
          iVar3 = RepeatedField<float>::size((this->field_0).repeated_float_value), iVar1 < iVar3;
          i_12 = i_12 + 1) {
        pfVar8 = RepeatedField<float>::Get((this->field_0).repeated_float_value,i_12);
        WireFormatLite::WriteFloatNoTag(*pfVar8,_i_1);
      }
      break;
    case TYPE_INT64:
      for (i_3 = 0; iVar1 = i_3,
          iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar3;
          i_3 = i_3 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_3);
        WireFormatLite::WriteInt64NoTag(*plVar6,_i_1);
      }
      break;
    case TYPE_UINT64:
      for (i_5 = 0; iVar1 = i_5,
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 < iVar3; i_5 = i_5 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_5);
        WireFormatLite::WriteUInt64NoTag(*puVar7,_i_1);
      }
      break;
    case TYPE_INT32:
      for (i_2 = 0; iVar1 = i_2,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          i_2 = i_2 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_2);
        WireFormatLite::WriteInt32NoTag(*piVar5,_i_1);
      }
      break;
    case TYPE_FIXED64:
      for (i_9 = 0; iVar1 = i_9,
          iVar3 = RepeatedField<unsigned_long>::size((this->field_0).repeated_uint64_value),
          iVar1 < iVar3; i_9 = i_9 + 1) {
        puVar7 = RepeatedField<unsigned_long>::Get((this->field_0).repeated_uint64_value,i_9);
        WireFormatLite::WriteFixed64NoTag(*puVar7,_i_1);
      }
      break;
    case TYPE_FIXED32:
      for (i_8 = 0; iVar1 = i_8,
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 < iVar3; i_8 = i_8 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_8);
        WireFormatLite::WriteFixed32NoTag(*puVar4,_i_1);
      }
      break;
    case TYPE_BOOL:
      for (local_54 = 0; iVar1 = local_54,
          iVar3 = RepeatedField<bool>::size((this->field_0).repeated_bool_value), iVar1 < iVar3;
          local_54 = local_54 + 1) {
        pbVar10 = RepeatedField<bool>::Get((this->field_0).repeated_bool_value,local_54);
        WireFormatLite::WriteBoolNoTag((bool)(*pbVar10 & 1),_i_1);
      }
      break;
    case TYPE_STRING:
    case TYPE_GROUP:
    case TYPE_MESSAGE:
    case TYPE_BYTES:
      LogMessage::LogMessage
                (&local_90,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
                 ,0x5bd);
      other = LogMessage::operator<<(&local_90,"Non-primitive types can\'t be packed.");
      LogFinisher::operator=((LogFinisher *)((long)&i_15 + 3),other);
      LogMessage::~LogMessage(&local_90);
      break;
    case TYPE_UINT32:
      for (i_4 = 0; iVar1 = i_4,
          iVar3 = RepeatedField<unsigned_int>::size((this->field_0).repeated_uint32_value),
          iVar1 < iVar3; i_4 = i_4 + 1) {
        puVar4 = RepeatedField<unsigned_int>::Get((this->field_0).repeated_uint32_value,i_4);
        WireFormatLite::WriteUInt32NoTag(*puVar4,_i_1);
      }
      break;
    case TYPE_ENUM:
      for (local_58 = 0; iVar1 = local_58,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          local_58 = local_58 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,local_58);
        WireFormatLite::WriteEnumNoTag(*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED32:
      for (i_10 = 0; iVar1 = i_10,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          i_10 = i_10 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_10);
        WireFormatLite::WriteSFixed32NoTag(*piVar5,_i_1);
      }
      break;
    case TYPE_SFIXED64:
      for (i_11 = 0; iVar1 = i_11,
          iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar3;
          i_11 = i_11 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_11);
        WireFormatLite::WriteSFixed64NoTag(*plVar6,_i_1);
      }
      break;
    case TYPE_SINT32:
      for (i_6 = 0; iVar1 = i_6,
          iVar3 = RepeatedField<int>::size((this->field_0).repeated_int32_value), iVar1 < iVar3;
          i_6 = i_6 + 1) {
        piVar5 = RepeatedField<int>::Get((this->field_0).repeated_int32_value,i_6);
        WireFormatLite::WriteSInt32NoTag(*piVar5,_i_1);
      }
      break;
    case MAX_FIELD_TYPE:
      for (i_7 = 0; iVar1 = i_7,
          iVar3 = RepeatedField<long>::size((this->field_0).repeated_int64_value), iVar1 < iVar3;
          i_7 = i_7 + 1) {
        plVar6 = RepeatedField<long>::Get((this->field_0).repeated_int64_value,i_7);
        WireFormatLite::WriteSInt64NoTag(*plVar6,_i_1);
      }
    }
  }
  return;
}

Assistant:

void ExtensionSet::Extension::SerializeFieldWithCachedSizes(
    int number,
    io::CodedOutputStream* output) const {
  if (is_repeated) {
    if (is_packed) {
      if (cached_size == 0) return;

      WireFormatLite::WriteTag(number,
          WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
      output->WriteVarint32(cached_size);

      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE##NoTag(                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
#undef HANDLE_TYPE

        case WireFormatLite::TYPE_STRING:
        case WireFormatLite::TYPE_BYTES:
        case WireFormatLite::TYPE_GROUP:
        case WireFormatLite::TYPE_MESSAGE:
          GOOGLE_LOG(FATAL) << "Non-primitive types can't be packed.";
          break;
      }
    } else {
      switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, LOWERCASE)                        \
        case WireFormatLite::TYPE_##UPPERCASE:                              \
          for (int i = 0; i < repeated_##LOWERCASE##_value->size(); i++) {  \
            WireFormatLite::Write##CAMELCASE(number,                        \
              repeated_##LOWERCASE##_value->Get(i), output);                \
          }                                                                 \
          break

        HANDLE_TYPE(   INT32,    Int32,   int32);
        HANDLE_TYPE(   INT64,    Int64,   int64);
        HANDLE_TYPE(  UINT32,   UInt32,  uint32);
        HANDLE_TYPE(  UINT64,   UInt64,  uint64);
        HANDLE_TYPE(  SINT32,   SInt32,   int32);
        HANDLE_TYPE(  SINT64,   SInt64,   int64);
        HANDLE_TYPE( FIXED32,  Fixed32,  uint32);
        HANDLE_TYPE( FIXED64,  Fixed64,  uint64);
        HANDLE_TYPE(SFIXED32, SFixed32,   int32);
        HANDLE_TYPE(SFIXED64, SFixed64,   int64);
        HANDLE_TYPE(   FLOAT,    Float,   float);
        HANDLE_TYPE(  DOUBLE,   Double,  double);
        HANDLE_TYPE(    BOOL,     Bool,    bool);
        HANDLE_TYPE(  STRING,   String,  string);
        HANDLE_TYPE(   BYTES,    Bytes,  string);
        HANDLE_TYPE(    ENUM,     Enum,    enum);
        HANDLE_TYPE(   GROUP,    Group, message);
        HANDLE_TYPE( MESSAGE,  Message, message);
#undef HANDLE_TYPE
      }
    }
  } else if (!is_cleared) {
    switch (real_type(type)) {
#define HANDLE_TYPE(UPPERCASE, CAMELCASE, VALUE)                 \
      case WireFormatLite::TYPE_##UPPERCASE:                     \
        WireFormatLite::Write##CAMELCASE(number, VALUE, output); \
        break

      HANDLE_TYPE(   INT32,    Int32,    int32_value);
      HANDLE_TYPE(   INT64,    Int64,    int64_value);
      HANDLE_TYPE(  UINT32,   UInt32,   uint32_value);
      HANDLE_TYPE(  UINT64,   UInt64,   uint64_value);
      HANDLE_TYPE(  SINT32,   SInt32,    int32_value);
      HANDLE_TYPE(  SINT64,   SInt64,    int64_value);
      HANDLE_TYPE( FIXED32,  Fixed32,   uint32_value);
      HANDLE_TYPE( FIXED64,  Fixed64,   uint64_value);
      HANDLE_TYPE(SFIXED32, SFixed32,    int32_value);
      HANDLE_TYPE(SFIXED64, SFixed64,    int64_value);
      HANDLE_TYPE(   FLOAT,    Float,    float_value);
      HANDLE_TYPE(  DOUBLE,   Double,   double_value);
      HANDLE_TYPE(    BOOL,     Bool,     bool_value);
      HANDLE_TYPE(  STRING,   String,  *string_value);
      HANDLE_TYPE(   BYTES,    Bytes,  *string_value);
      HANDLE_TYPE(    ENUM,     Enum,     enum_value);
      HANDLE_TYPE(   GROUP,    Group, *message_value);
#undef HANDLE_TYPE
      case WireFormatLite::TYPE_MESSAGE:
        if (is_lazy) {
          lazymessage_value->WriteMessage(number, output);
        } else {
          WireFormatLite::WriteMessage(number, *message_value, output);
        }
        break;
    }
  }
}